

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APInt.h
# Opt level: O0

APInt * __thiscall llvm::APInt::operator<<=(APInt *this,uint ShiftAmt)

{
  bool bVar1;
  uint ShiftAmt_local;
  APInt *this_local;
  
  if (this->BitWidth < ShiftAmt) {
    __assert_fail("ShiftAmt <= BitWidth && \"Invalid shift amount\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/APInt.h"
                  ,0x389,"APInt &llvm::APInt::operator<<=(unsigned int)");
  }
  bVar1 = isSingleWord(this);
  if (bVar1) {
    if (ShiftAmt == this->BitWidth) {
      (this->U).VAL = 0;
    }
    else {
      (this->U).VAL = (this->U).VAL << ((byte)ShiftAmt & 0x3f);
    }
    this_local = clearUnusedBits(this);
  }
  else {
    shlSlowCase(this,ShiftAmt);
    this_local = this;
  }
  return this_local;
}

Assistant:

APInt &operator<<=(unsigned ShiftAmt) {
    assert(ShiftAmt <= BitWidth && "Invalid shift amount");
    if (isSingleWord()) {
      if (ShiftAmt == BitWidth)
        U.VAL = 0;
      else
        U.VAL <<= ShiftAmt;
      return clearUnusedBits();
    }
    shlSlowCase(ShiftAmt);
    return *this;
  }